

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpListener.cpp
# Opt level: O2

int __thiscall
TcpListener::accept(TcpListener *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int fd;
  TcpConn *this_00;
  undefined1 auStack_38 [8];
  sockaddr_in addr;
  socklen_t local_1c [2];
  socklen_t l;
  
  auStack_38._0_2_ = 0;
  auStack_38[2] = '\0';
  auStack_38[3] = '\0';
  auStack_38[4] = '\0';
  auStack_38[5] = '\0';
  auStack_38[6] = '\0';
  auStack_38[7] = '\0';
  addr.sin_family = 0;
  addr.sin_port = 0;
  addr.sin_addr.s_addr = 0;
  local_1c[0] = 0x10;
  fd = ::accept((this->m_socket).super_Socket._fd,(sockaddr *)auStack_38,local_1c);
  if (fd < 0) {
    this_00 = (TcpConn *)0x0;
  }
  else {
    this_00 = (TcpConn *)operator_new(0x50);
    TcpConn::TcpConn(this_00,fd);
    (*(this_00->super_PollObj)._vptr_PollObj[6])(this_00);
  }
  return (int)this_00;
}

Assistant:

TcpConn *TcpListener::accept()
{
    struct sockaddr_in addr = {0};
    socklen_t l = sizeof(addr);
    socket_t sock = ::accept(m_socket.GetFd(), (struct sockaddr *)&addr, &l);
    if (sock < 0)
    {
        return nullptr;
    }
    TcpConn *tc = new TcpConn(sock);
    tc->Init();
    //ts->makeKeepAlive(30, 5, 3);
    return tc;
}